

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  ImVector<char_*> *this_00;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int i;
  long lVar4;
  char *local_28;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  this_00 = &this->History;
  uVar3 = (ulong)(uint)(this->History).Size;
  do {
    if ((int)uVar3 < 1) goto LAB_0014253a;
    lVar4 = uVar3 - 1;
    uVar3 = uVar3 - 1;
    iVar1 = Stricmp((this->History).Data[lVar4],command_line);
  } while (iVar1 != 0);
  free((this->History).Data[uVar3]);
  ImVector<char_*>::erase(this_00,(this->History).Data + (uVar3 & 0xffffffff));
LAB_0014253a:
  local_28 = Strdup(command_line);
  ImVector<char_*>::push_back(this_00,&local_28);
  iVar1 = Stricmp(command_line,"CLEAR");
  if (iVar1 == 0) {
    ClearLog(this);
  }
  else {
    iVar1 = Stricmp(command_line,"HELP");
    if (iVar1 == 0) {
      AddLog(this,"Commands:");
      for (lVar4 = 0; lVar4 < (this->Commands).Size; lVar4 = lVar4 + 1) {
        AddLog(this,"- %s",(this->Commands).Data[lVar4]);
      }
    }
    else {
      iVar1 = Stricmp(command_line,"HISTORY");
      if (iVar1 == 0) {
        uVar2 = this_00->Size;
        uVar3 = 10;
        if (10 < (int)uVar2) {
          uVar3 = (ulong)uVar2;
        }
        for (uVar3 = uVar3 - 10; (long)uVar3 < (long)(int)uVar2; uVar3 = uVar3 + 1) {
          AddLog(this,"%3d: %s\n",uVar3 & 0xffffffff,(this->History).Data[uVar3]);
          uVar2 = (this->History).Size;
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size - 1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }